

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_model.c
# Opt level: O0

int32 ngram_class_prob(ngram_class_t *lmclass,int32 wid)

{
  uint uVar1;
  bool bVar2;
  uint local_24;
  int32 hash;
  int32 base_wid;
  int32 wid_local;
  ngram_class_t *lmclass_local;
  
  uVar1 = wid & 0xffffff;
  if (((int)uVar1 < lmclass->start_wid) || (lmclass->start_wid + lmclass->n_words < (int)uVar1)) {
    local_24 = wid & lmclass->n_hash - 1U;
    while( true ) {
      bVar2 = false;
      if (local_24 != 0xffffffff) {
        bVar2 = lmclass->nword_hash[(int)local_24].wid != wid;
      }
      if (!bVar2) break;
      local_24 = lmclass->nword_hash[(int)local_24].next;
    }
    if (local_24 == 0xffffffff) {
      lmclass_local._4_4_ = 1;
    }
    else {
      lmclass_local._4_4_ = lmclass->nword_hash[(int)local_24].prob1;
    }
  }
  else {
    lmclass_local._4_4_ = lmclass->prob1[(int)(uVar1 - lmclass->start_wid)];
  }
  return lmclass_local._4_4_;
}

Assistant:

int32
ngram_class_prob(ngram_class_t * lmclass, int32 wid)
{
    int32 base_wid = NGRAM_BASEWID(wid);

    if (base_wid < lmclass->start_wid
        || base_wid > lmclass->start_wid + lmclass->n_words) {
        int32 hash;

        /* Look it up in the hash table. */
        hash = wid & (lmclass->n_hash - 1);
        while (hash != -1 && lmclass->nword_hash[hash].wid != wid)
            hash = lmclass->nword_hash[hash].next;
        if (hash == -1)
            return 1;
        return lmclass->nword_hash[hash].prob1;
    }
    else {
        return lmclass->prob1[base_wid - lmclass->start_wid];
    }
}